

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

char duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,signed_char>
               (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  hugeint_t input_00;
  bool bVar1;
  undefined8 in_R8;
  VectorTryCastData *data;
  char output;
  undefined1 in_stack_00000160 [16];
  VectorTryCastData *in_stack_ffffffffffffff58;
  string *idx_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  string local_70 [32];
  undefined8 local_50;
  char local_31;
  undefined8 local_30;
  char local_1;
  
  input_00.upper = in_stack_ffffffffffffff80;
  input_00.lower = in_stack_ffffffffffffff78;
  local_30 = in_R8;
  bVar1 = NumericTryCast::Operation<duckdb::hugeint_t,signed_char>
                    (input_00,(char *)in_stack_ffffffffffffff70,
                     SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  if (bVar1) {
    local_1 = local_31;
  }
  else {
    local_50 = local_30;
    idx_00 = local_70;
    CastExceptionText<duckdb::hugeint_t,signed_char>((hugeint_t)in_stack_00000160);
    local_1 = HandleVectorCastError::Operation<signed_char>
                        (in_stack_ffffffffffffff70,
                         (ValidityMask *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(idx_t)idx_00
                         ,in_stack_ffffffffffffff58);
    ::std::__cxx11::string::~string(local_70);
  }
  return local_1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}